

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O2

void __thiscall AGSSock::Pool::add(Pool *this,Socket *sock)

{
  value_type *__v;
  __ireturn_type _Var1;
  Socket *local_20;
  
  __v = &local_20;
  local_20 = sock;
  pthread_mutex_lock((pthread_mutex_t *)&this->guard_);
  _Var1 = std::__detail::
          _Insert_base<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<AGSSock::Socket_*,_AGSSock::Socket_*,_std::allocator<AGSSock::Socket_*>,_std::__detail::_Identity,_std::equal_to<AGSSock::Socket_*>,_std::hash<AGSSock::Socket_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)this,__v);
  if ((((undefined1  [16])_Var1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
     ((this->sockets_)._M_h._M_element_count != 1)) {
    AGSSockAPI::Beacon::signal(&this->beacon_,(int)__v,_Var1._8_8_);
  }
  else {
    AGSSockAPI::Thread::start(&this->thread_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->guard_);
  return;
}

Assistant:

void Pool::add(Socket *sock)
{
	Mutex::Lock lock(guard_);

	if (sockets_.insert(sock).second && sockets_.size() == 1)
		thread_.start();
	else
		beacon_.signal();
}